

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::TokenList&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,TokenList *args_2)

{
  Info *pIVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  UnconditionalBranchDirectiveSyntax *pUVar9;
  
  pUVar9 = (UnconditionalBranchDirectiveSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnconditionalBranchDirectiveSyntax *)this->endPtr < pUVar9 + 1) {
    pUVar9 = (UnconditionalBranchDirectiveSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pUVar9 + 1);
  }
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.kind = *args;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pUVar9->super_DirectiveSyntax).directive.kind = TVar4;
  (pUVar9->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pUVar9->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pUVar9->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pUVar9->super_DirectiveSyntax).directive.info = pIVar1;
  uVar8 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_2->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pUVar9->disabledTokens).super_SyntaxListBase.childCount =
       (args_2->super_SyntaxListBase).childCount;
  sVar3 = (args_2->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args_2->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0988;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pUVar9;
  return pUVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }